

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::report_selfint_edge
          (tetgenmesh *this,point e1,point e2,face *iedge,triface *itet,interresult dir)

{
  uint uVar1;
  uint uVar2;
  tetrahedron ppdVar3;
  shellface C;
  shellface D;
  double *pa;
  double *pb;
  double *pc;
  long lVar4;
  uint uVar5;
  point pdVar6;
  shellface *pppdVar7;
  ulong uVar8;
  long lVar9;
  point pdVar10;
  point pdVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  shellface ppdVar21;
  int iVar22;
  point local_b8;
  face colseg;
  undefined8 local_88;
  face checkseg;
  double Q [3];
  double tq;
  double tp;
  
  if (iedge == (face *)0x0) {
    uVar18 = 0;
    uVar14 = 0;
    iVar22 = 0;
    ppdVar21 = (shellface)0x0;
    pdVar6 = (point)0x0;
    local_b8 = (point)0x0;
  }
  else {
    pppdVar7 = iedge->sh;
    if (pppdVar7[5] == (shellface)0x0) {
      local_b8 = farsorg(this,iedge);
      pdVar6 = farsdest(this,iedge);
      pppdVar7 = iedge->sh;
      iVar22 = 1;
      if (((ulong)pppdVar7[iedge->shver >> 1] & 0xfffffffffffffff8) == 0) {
        lVar12 = (long)this->shmarkindex;
        uVar18 = 0;
      }
      else {
        lVar12 = (long)this->shmarkindex;
        uVar18 = (ulong)*(uint *)(((ulong)pppdVar7[iedge->shver >> 1] & 0xfffffffffffffff8) +
                                 lVar12 * 4);
      }
      ppdVar21 = (shellface)0x0;
    }
    else {
      ppdVar21 = pppdVar7[sapexpivot[iedge->shver]];
      lVar12 = (long)this->shmarkindex;
      uVar18 = (ulong)*(uint *)((long)pppdVar7 + lVar12 * 4);
      iVar22 = 2;
      pdVar6 = e2;
      local_b8 = e1;
    }
    uVar14 = *(uint *)((long)pppdVar7 + lVar12 * 4);
  }
  switch(dir) {
  case SHAREEDGE:
    colseg.sh = (shellface *)0x0;
    colseg.shver = 0;
    tsspivot1(this,itet,&colseg);
    if (iVar22 == 2) {
      puts("PLC Error:  A segment lies in a facet.");
      printf("  Segment: [%d, %d] #%d\n",
             (ulong)*(uint *)((long)colseg.sh[sorgpivot[colseg.shver]] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)colseg.sh[sdestpivot[colseg.shver]] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)colseg.sh + (long)this->shmarkindex * 4));
      lVar12 = (long)this->pointmarkindex;
      uVar13 = (ulong)*(uint *)((long)local_b8 + lVar12 * 4);
      uVar8 = (ulong)*(uint *)((long)pdVar6 + lVar12 * 4);
      uVar16 = (ulong)*(uint *)((long)ppdVar21 + lVar12 * 4);
      pcVar20 = "  Facet:   [%d,%d,%d] #%d\n";
      uVar18 = (ulong)uVar14;
    }
    else {
      if (iVar22 != 1) {
        return 0;
      }
      if (colseg.sh == iedge->sh) {
        iVar22 = 2;
        goto LAB_00119249;
      }
      uVar16 = (ulong)uVar14;
      ppdVar21 = colseg.sh[colseg.shver >> 1];
      puts("PLC Error:  Two segments are overlapping.");
      if (((ulong)ppdVar21 & 0xfffffffffffffff8) == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)*(uint *)(((ulong)ppdVar21 & 0xfffffffffffffff8) +
                                (long)this->shmarkindex * 4);
      }
      printf("  Segment 1: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)colseg.sh[sorgpivot[colseg.shver]] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)colseg.sh[sdestpivot[colseg.shver]] +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)colseg.sh + (long)this->shmarkindex * 4),uVar8);
      uVar13 = (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4);
      uVar8 = (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4);
      pcVar20 = "  Segment 2: [%d, %d] #%d (%d)\n";
    }
    goto LAB_001194f1;
  case SHAREFACE:
    colseg.sh = (shellface *)0x0;
    colseg.shver = 0;
    tspivot(this,itet,&colseg);
    if ((iVar22 != 2) || (colseg.sh == iedge->sh)) {
      iVar22 = 2;
      goto LAB_00119249;
    }
    puts("PLC Error:  Two facets are overlapping.");
    lVar12 = (long)this->pointmarkindex;
    printf("  Facet 1:  [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)local_b8 + lVar12 * 4),
           (ulong)*(uint *)((long)pdVar6 + lVar12 * 4),(ulong)*(uint *)((long)ppdVar21 + lVar12 * 4)
           ,(ulong)uVar14);
    lVar12 = (long)colseg.shver;
    lVar19 = (long)this->pointmarkindex;
    uVar13 = (ulong)*(uint *)((long)colseg.sh[sorgpivot[lVar12]] + lVar19 * 4);
    uVar8 = (ulong)*(uint *)((long)colseg.sh[sdestpivot[lVar12]] + lVar19 * 4);
    uVar16 = (ulong)*(uint *)((long)colseg.sh[sapexpivot[lVar12]] + lVar19 * 4);
    uVar18 = (ulong)*(uint *)((long)colseg.sh + (long)this->shmarkindex * 4);
    pcVar20 = "  Facet 2:  [%d,%d,%d] #%d\n";
LAB_001194f1:
    printf(pcVar20,uVar13,uVar8,uVar16,uVar18);
    return 0;
  default:
    iVar22 = 2;
    goto LAB_00119249;
  case ACROSSVERT:
    break;
  case ACROSSEDGE:
    if (itet->tet[8] == (tetrahedron)0x0) {
      return 0;
    }
    if (itet->tet[8][ver2edge[itet->ver]] == (double *)0x0) {
      return 0;
    }
    checkseg.sh = (shellface *)0x0;
    checkseg.shver = 0;
    tsspivot1(this,itet,&checkseg);
    uVar16 = (ulong)checkseg.sh[checkseg.shver >> 1] & 0xfffffffffffffff8;
    C = checkseg.sh[sorgpivot[checkseg.shver]];
    D = checkseg.sh[sdestpivot[checkseg.shver]];
    tp = 0.0;
    tq = 0.0;
    linelineint(this,e1,e2,(double *)C,(double *)D,(double *)&colseg,Q,&tp,&tq);
    if (iVar22 == 2) {
      uVar5 = 0;
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",colseg.sh,CONCAT44(colseg._12_4_,colseg.shver),local_88);
      if (uVar16 != 0) {
        uVar5 = *(uint *)(uVar16 + (long)this->shmarkindex * 4);
      }
      printf("  Segment: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)C + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)D + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)checkseg.sh + (long)this->shmarkindex * 4),(ulong)uVar5);
      lVar12 = (long)this->pointmarkindex;
      uVar5 = *(uint *)((long)local_b8 + lVar12 * 4);
      uVar1 = *(uint *)((long)pdVar6 + lVar12 * 4);
      uVar2 = *(uint *)((long)ppdVar21 + lVar12 * 4);
      pcVar20 = "  Facet:   [%d, %d, %d] #%d.\n";
LAB_0011940a:
      printf(pcVar20,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,(ulong)uVar14);
    }
    else if (iVar22 == 1) {
      printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",colseg.sh,
             CONCAT44(colseg._12_4_,colseg.shver),local_88);
      uVar15 = 0;
      printf("  Segment 1: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),(ulong)uVar14,uVar18);
      uVar5 = *(uint *)((long)C + (long)this->pointmarkindex * 4);
      uVar1 = *(uint *)((long)D + (long)this->pointmarkindex * 4);
      uVar2 = *(uint *)((long)checkseg.sh + (long)this->shmarkindex * 4);
      if (uVar16 != 0) {
        uVar15 = *(uint *)(uVar16 + (long)this->shmarkindex * 4);
      }
      pcVar20 = "  Segment 2: [%d, %d] #%d (%d)\n";
      uVar14 = uVar15;
      goto LAB_0011940a;
    }
    iVar22 = 3;
    goto LAB_00119249;
  case ACROSSFACE:
    if (itet->tet[9] == (tetrahedron)0x0) {
      return 0;
    }
    if (itet->tet[9][itet->ver & 3] == (double *)0x0) {
      return 0;
    }
    Q[0] = 0.0;
    Q[1]._0_4_ = 0;
    tspivot(this,itet,(face *)Q);
    lVar12 = (long)Q[1]._0_4_;
    pa = *(double **)((long)Q[0] + (long)sorgpivot[lVar12] * 8);
    pb = *(double **)((long)Q[0] + (long)sdestpivot[lVar12] * 8);
    pc = *(double **)((long)Q[0] + (long)sapexpivot[lVar12] * 8);
    checkseg.sh = (shellface *)0x0;
    planelineint(this,pa,pb,pc,e1,e2,(double *)&colseg,(double *)&checkseg);
    if (iVar22 == 2) {
      printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",colseg.sh,
             CONCAT44(colseg._12_4_,colseg.shver),local_88);
      lVar12 = (long)this->pointmarkindex;
      printf("  Facet 1: [%d, %d, %d] #%d.\n",(ulong)*(uint *)((long)local_b8 + lVar12 * 4),
             (ulong)*(uint *)((long)pdVar6 + lVar12 * 4),
             (ulong)*(uint *)((long)ppdVar21 + lVar12 * 4),(ulong)uVar14);
      lVar12 = (long)this->pointmarkindex;
      uVar14 = *(uint *)((long)pa + lVar12 * 4);
      uVar5 = *(uint *)((long)pb + lVar12 * 4);
      uVar1 = *(uint *)((long)pc + lVar12 * 4);
      uVar2 = *(uint *)((long)Q[0] + (long)this->shmarkindex * 4);
      pcVar20 = "  Facet 2: [%d, %d, %d] #%d.\n";
LAB_001194a2:
      printf(pcVar20,(ulong)uVar14,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2);
    }
    else if (iVar22 == 1) {
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",colseg.sh,CONCAT44(colseg._12_4_,colseg.shver),local_88);
      printf("  Segment: [%d, %d] #%d (%d)\n",
             (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),(ulong)uVar14,uVar18);
      lVar12 = (long)this->pointmarkindex;
      uVar14 = *(uint *)((long)pa + lVar12 * 4);
      uVar5 = *(uint *)((long)pb + lVar12 * 4);
      uVar1 = *(uint *)((long)pc + lVar12 * 4);
      uVar2 = *(uint *)((long)Q[0] + (long)this->shmarkindex * 4);
      pcVar20 = "  Facet:   [%d, %d, %d] #%d.\n";
      goto LAB_001194a2;
    }
    iVar22 = 3;
    goto LAB_00119249;
  }
  ppdVar3 = itet->tet[destpivot[itet->ver]];
  switch(*(int *)((long)ppdVar3 + (long)this->pointmarkindex * 4 + 4) >> 8) {
  case 2:
  case 4:
  case 5:
    if (iVar22 == 2) {
      puts("PLC Error:  A vertex lies in a facet.");
      printf("  Vertex: [%d] (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],ppdVar3[2],
             (ulong)*(uint *)((long)ppdVar3 + (long)this->pointmarkindex * 4));
      lVar12 = (long)this->pointmarkindex;
      uVar17 = (ulong)*(uint *)((long)local_b8 + lVar12 * 4);
      uVar13 = (ulong)*(uint *)((long)pdVar6 + lVar12 * 4);
      uVar8 = (ulong)*(uint *)((long)ppdVar21 + lVar12 * 4);
      pcVar20 = "  Facet:  [%d,%d,%d] #%d\n";
      uVar18 = (ulong)uVar14;
    }
    else {
      if (iVar22 != 1) break;
      uVar8 = (ulong)uVar14;
      puts("PLC Error:  A vertex lies in a segment.");
      printf("  Vertex:  [%d] (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],ppdVar3[2],
             (ulong)*(uint *)((long)ppdVar3 + (long)this->pointmarkindex * 4));
      uVar17 = (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4);
      uVar13 = (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4);
      pcVar20 = "  Segment: [%d, %d] #%d (%d)\n";
    }
    goto LAB_00119239;
  default:
switchD_00118c09_caseD_3:
    terminatetetgen(this,2);
    break;
  case 6:
    uVar5 = (uint)ppdVar3[(long)this->point2simindex + 2];
    colseg.shver = uVar5 & 7;
    colseg.sh = (shellface *)((ulong)ppdVar3[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
    uVar16 = *(ulong *)((long)colseg.sh + (ulong)(uVar5 & 6) * 4) & 0xfffffffffffffff8;
    pdVar10 = farsorg(this,&colseg);
    pdVar11 = farsdest(this,&colseg);
    if (iVar22 == 2) {
      uVar5 = 0;
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],ppdVar3[2]);
      if (uVar16 != 0) {
        uVar5 = *(uint *)(uVar16 + (long)this->shmarkindex * 4);
      }
      printf("  Segment: [%d, %d], #%d (%d)\n",
             (ulong)*(uint *)((long)pdVar10 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar11 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)colseg.sh + (long)this->shmarkindex * 4),(ulong)uVar5);
      lVar12 = (long)this->pointmarkindex;
      uVar5 = *(uint *)((long)local_b8 + lVar12 * 4);
      uVar1 = *(uint *)((long)pdVar6 + lVar12 * 4);
      uVar2 = *(uint *)((long)ppdVar21 + lVar12 * 4);
      pcVar20 = "  Facet:   [%d,%d,%d] #%d\n";
    }
    else {
      if (iVar22 != 1) break;
      printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],
             ppdVar3[2]);
      uVar15 = 0;
      printf("  Segment 1: [%d, %d], #%d (%d)\n",
             (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),(ulong)uVar14,uVar18);
      uVar5 = *(uint *)((long)pdVar10 + (long)this->pointmarkindex * 4);
      uVar1 = *(uint *)((long)pdVar11 + (long)this->pointmarkindex * 4);
      uVar2 = *(uint *)((long)colseg.sh + (long)this->shmarkindex * 4);
      if (uVar16 != 0) {
        uVar15 = *(uint *)(uVar16 + (long)this->shmarkindex * 4);
      }
      pcVar20 = "  Segment 2: [%d, %d], #%d (%d)\n";
      uVar14 = uVar15;
    }
    printf(pcVar20,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,(ulong)uVar14);
    break;
  case 7:
    uVar16 = (ulong)ppdVar3[(long)this->point2simindex + 2] & 0xfffffffffffffff8;
    if (uVar16 == 0) goto switchD_00118c09_caseD_3;
    uVar8 = (ulong)(((uint)ppdVar3[(long)this->point2simindex + 2] & 7) << 2);
    lVar12 = *(long *)(uVar16 + (long)*(int *)((long)sorgpivot + uVar8) * 8);
    lVar19 = *(long *)(uVar16 + (long)*(int *)((long)sdestpivot + uVar8) * 8);
    lVar4 = *(long *)(uVar16 + (long)*(int *)((long)sapexpivot + uVar8) * 8);
    if (iVar22 == 2) {
      printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],
             ppdVar3[2]);
      lVar9 = (long)this->pointmarkindex;
      printf("  Facet 1: [%d, %d, %d] #%d.\n",(ulong)*(uint *)((long)local_b8 + lVar9 * 4),
             (ulong)*(uint *)((long)pdVar6 + lVar9 * 4),(ulong)*(uint *)((long)ppdVar21 + lVar9 * 4)
             ,(ulong)uVar14);
      lVar9 = (long)this->pointmarkindex;
      uVar17 = (ulong)*(uint *)(lVar12 + lVar9 * 4);
      uVar13 = (ulong)*(uint *)(lVar19 + lVar9 * 4);
      uVar8 = (ulong)*(uint *)(lVar4 + lVar9 * 4);
      uVar18 = (ulong)*(uint *)(uVar16 + (long)this->shmarkindex * 4);
      pcVar20 = "  Facet 2: [%d, %d, %d] #%d.\n";
    }
    else {
      if (iVar22 != 1) break;
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",*ppdVar3,ppdVar3[1],ppdVar3[2]);
      printf("  Segment : [%d, %d], #%d (%d)\n",
             (ulong)*(uint *)((long)local_b8 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),(ulong)uVar14,uVar18);
      lVar9 = (long)this->pointmarkindex;
      uVar17 = (ulong)*(uint *)(lVar12 + lVar9 * 4);
      uVar13 = (ulong)*(uint *)(lVar19 + lVar9 * 4);
      uVar8 = (ulong)*(uint *)(lVar4 + lVar9 * 4);
      uVar18 = (ulong)*(uint *)(uVar16 + (long)this->shmarkindex * 4);
      pcVar20 = "  Facet   : [%d, %d, %d]  #%d.\n";
    }
LAB_00119239:
    printf(pcVar20,uVar17,uVar13,uVar8,uVar18);
  }
  iVar22 = 3;
LAB_00119249:
  terminatetetgen(this,iVar22);
  return 0;
}

Assistant:

int tetgenmesh::report_selfint_edge(point e1, point e2, face *iedge,
  triface* itet, enum interresult dir)
{
  point forg = NULL, fdest = NULL, fapex = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  if (iedge != NULL) {
    if (iedge->sh[5] != NULL) {
      etype = 2;  // A subface
      forg = e1;
      fdest = e2;
      fapex = sapex(*iedge);
      facemark = shellmark(*iedge);
    } else {
      etype = 1;  // A segment
      forg = farsorg(*iedge);
      fdest = farsdest(*iedge);
      // Get a facet containing this segment.
      face parentsh;
      spivot(*iedge, parentsh);
      if (parentsh.sh != NULL) {
        facemark = shellmark(parentsh);
      }
    }
    geomtag = shellmark(*iedge);
  }

  if (dir == SHAREEDGE) {
    // Two edges (segments) are coincide.
    face colseg;
    tsspivot1(*itet, colseg);
    if (etype == 1) {
      if (colseg.sh != iedge->sh) {
        face parentsh;
        spivot(colseg, parentsh);
        printf("PLC Error:  Two segments are overlapping.\n");
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(sorg(colseg)),
               pointmark(sdest(colseg)), shellmark(colseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(forg),
               pointmark(fdest), geomtag, facemark);
      } else {
        // Two identical segments. Why report it?
        terminatetetgen(this, 2); 
      }
    } else if (etype == 2) {
      printf("PLC Error:  A segment lies in a facet.\n");
      printf("  Segment: [%d, %d] #%d\n", pointmark(sorg(colseg)),
             pointmark(sdest(colseg)), shellmark(colseg));
      printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
             pointmark(fdest), pointmark(fapex), geomtag);
    }
  } else if (dir == SHAREFACE) {
    // Two triangles (subfaces) are coincide.
	face colface;
    tspivot(*itet, colface);
	if (etype == 2) {
	  if (colface.sh != iedge->sh) {
	    printf("PLC Error:  Two facets are overlapping.\n");
		printf("  Facet 1:  [%d,%d,%d] #%d\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
		printf("  Facet 2:  [%d,%d,%d] #%d\n", pointmark(sorg(colface)), 
             pointmark(sdest(colface)), pointmark(sapex(colface)), 
			 shellmark(colface));
	  } else {
	    // Two identical subfaces. Why report it?
        terminatetetgen(this, 2); 
	  }
	} else {
	  terminatetetgen(this, 2);
	}
  } else if (dir == ACROSSVERT) {
    point pp = dest(*itet);
    if ((pointtype(pp) == RIDGEVERTEX) || (pointtype(pp) == FACETVERTEX)
        || (pointtype(pp) == VOLVERTEX)) {
      if (etype == 1) {
        printf("PLC Error:  A vertex lies in a segment.\n");
        printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
      } else if (etype == 2) {
        printf("PLC Error:  A vertex lies in a facet.\n");
        printf("  Vertex: [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Facet:  [%d,%d,%d] #%d\n", pointmark(forg), pointmark(fdest),
               pointmark(fapex), geomtag);
      }
    } else if (pointtype(pp) == FREESEGVERTEX) {
      face parentseg, parentsh;
      sdecode(point2sh(pp), parentseg);
      spivot(parentseg, parentsh);
      if (parentseg.sh != NULL) {
        point p1 = farsorg(parentseg);
        point p2 = farsdest(parentseg);
        if (etype == 1) {
          printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Segment 1: [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Segment 2: [%d, %d], #%d (%d)\n", pointmark(p1), 
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
        } else if (etype == 2) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment: [%d, %d], #%d (%d)\n", pointmark(p1),
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEFACETVERTEX) {
      face parentsh;
      sdecode(point2sh(pp), parentsh);
      if (parentsh.sh != NULL) {
        point p1 = sorg(parentsh);
        point p2 = sdest(parentsh);
        point p3 = sapex(parentsh);
        if (etype == 1) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment : [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Facet   : [%d, %d, %d]  #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        } else if (etype == 2) {
          printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
          printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEVOLVERTEX) {
      // This is not a PLC error. 
      // We should shift the vertex.
      // not down yet.
      terminatetetgen(this, 2); // Report a bug.
    } else {
      terminatetetgen(this, 2); // Report a bug.
    }
    terminatetetgen(this, 3);
  } else if (dir == ACROSSEDGE) {
    if (issubseg(*itet)) {
      face checkseg;
      tsspivot1(*itet, checkseg);
      face parentsh;
      spivot(checkseg, parentsh);
      // Calulcate the intersecting point.
      point p1 = sorg(checkseg);
      point p2 = sdest(checkseg);
      REAL P[3], Q[3], tp = 0, tq = 0;
      linelineint(e1, e2, p1, p2, P, Q, &tp, &tq);
      if (etype == 1) {
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
               P[0], P[1], P[2]);
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
      } else if (etype == 2) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", P[0], P[1], P[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
      }
      terminatetetgen(this, 3);
    }
  } else if (dir == ACROSSFACE) {
    if (issubface(*itet)) {
      face checksh;
      tspivot(*itet, checksh);
      point p1 = sorg(checksh);
      point p2 = sdest(checksh);
      point p3 = sapex(checksh);
      REAL ip[3], u = 0;
      planelineint(p1, p2, p3, e1, e2, ip, &u);
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      } else if (etype == 2) {
        printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
               ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
        printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      }
      terminatetetgen(this, 3);
    }
  } else {
    // An unknown 'dir'.
    terminatetetgen(this, 2);
  }
  return 0;
}